

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * scalarmax_perform(t_int *w)

{
  float fVar1;
  float local_34;
  int local_2c;
  t_sample g;
  int n;
  t_sample *out;
  float *pfStack_18;
  t_float f;
  t_sample *in;
  t_int *w_local;
  
  fVar1 = *(float *)w[2];
  local_2c = (int)w[4];
  _g = (float *)w[3];
  pfStack_18 = (float *)w[1];
  while (local_2c != 0) {
    local_34 = *pfStack_18;
    if (local_34 < fVar1) {
      local_34 = fVar1;
    }
    *_g = local_34;
    local_2c = local_2c + -1;
    _g = _g + 1;
    pfStack_18 = pfStack_18 + 1;
  }
  return w + 5;
}

Assistant:

t_int *scalarmax_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float f = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample g = *in++;
        *out++ = (f > g ? f : g);
    }
    return (w+5);
}